

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initdsp.c
# Opt level: O1

void flush_display_buffer(void)

{
  (*currentdsp->bitblt_to_screen)
            (currentdsp,DisplayRegion68k,(currentdsp->Visible).x,(currentdsp->Visible).y,
             (currentdsp->Visible).width,(currentdsp->Visible).height);
  return;
}

Assistant:

void flush_display_buffer(void) {
#ifdef SDL
  sdl_notify_damage(0, 0, sdl_displaywidth, sdl_displayheight);
#endif
#ifdef XWINDOW
  (currentdsp->bitblt_to_screen)(currentdsp, DisplayRegion68k, currentdsp->Visible.x,
                                 currentdsp->Visible.y, currentdsp->Visible.width,
                                 currentdsp->Visible.height);
#elif DOS
  TPRINT(("Enter flush_display_buffer\n"));
  (currentdsp->bitblt_to_screen)(currentdsp, DisplayRegion68k, 0, 0, currentdsp->Display.width,
                                 currentdsp->Display.height);
  TPRINT(("Exit flush_display_buffer\n"));
#endif /* DOS */
}